

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_test(stbi__context *s)

{
  int iVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  stbi_uc *psVar4;
  stbi_uc sVar5;
  
  psVar4 = s->img_buffer;
  psVar2 = s->img_buffer_end;
  if (psVar4 < psVar2) {
    s->img_buffer = psVar4 + 1;
    sVar5 = *psVar4;
    psVar4 = psVar4 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    sVar5 = '\0';
  }
  else {
    psVar2 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar2 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar5 = '\0';
    }
    else {
      sVar5 = *psVar2;
      psVar2 = psVar2 + iVar1;
    }
    psVar4 = s->buffer_start + 1;
    s->img_buffer_end = psVar2;
    s->img_buffer = psVar4;
  }
  if (psVar4 < psVar2) {
    s->img_buffer = psVar4 + 1;
    sVar3 = *psVar4;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0010c586;
    psVar2 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar2,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      psVar2 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar3 = '\0';
    }
    else {
      sVar3 = *psVar2;
      psVar2 = psVar2 + iVar1;
    }
    s->img_buffer_end = psVar2;
    s->img_buffer = s->buffer_start + 1;
  }
  if ((sVar5 == 'P') && (0xfd < (byte)(sVar3 - 0x37))) {
    return 1;
  }
LAB_0010c586:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int      stbi__pnm_test(stbi__context *s)
{
   char p, t;
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind( s );
       return 0;
   }
   return 1;
}